

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.cpp
# Opt level: O1

string * __thiscall
hdc::Parameter::getUniqueCppName_abi_cxx11_(string *__return_storage_ptr__,Parameter *this)

{
  ostream *poVar1;
  stringstream s;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1c0._M_dataplus._M_p._0_1_ = 0x70;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_190,(char *)&local_1c0,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_Variable).localName);
  local_1c0._M_dataplus._M_p._0_1_ = 0x5f;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1c0,1);
  Variable::getName_abi_cxx11_(&local_1c0,&this->super_Variable);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(char *)CONCAT71(local_1c0._M_dataplus._M_p._1_7_,
                                     local_1c0._M_dataplus._M_p._0_1_),local_1c0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1c0._M_dataplus._M_p._1_7_,local_1c0._M_dataplus._M_p._0_1_) !=
      &local_1c0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1c0._M_dataplus._M_p._1_7_,local_1c0._M_dataplus._M_p._0_1_));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string Parameter::getUniqueCppName() {
    std::stringstream s;

    s << 'p' << localName << '_' << getName();
    return s.str();
}